

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerEncode.cpp
# Opt level: O1

bool EncodeSize(size_t size,uchar *out,size_t cbOut,size_t *cbUsed)

{
  bool bVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  uchar local_10 [8];
  uchar tmp [8];
  
  local_10[0] = '\0';
  local_10[1] = '\0';
  local_10[2] = '\0';
  local_10[3] = '\0';
  local_10[4] = '\0';
  local_10[5] = '\0';
  local_10[6] = '\0';
  local_10[7] = '\0';
  if (size < 0x80 && cbOut != 0) {
    *out = (uchar)size;
    *cbUsed = 1;
  }
  else {
    sVar4 = 1;
    lVar2 = 0;
    do {
      lVar5 = lVar2;
      sVar3 = sVar4;
      if (lVar5 == -7) goto LAB_001377d9;
      tmp[lVar5 + -1] = (uchar)size;
      uVar6 = size >> 8;
      sVar4 = sVar3 + 1;
      bVar1 = 0xff < size;
      size = uVar6;
      lVar2 = lVar5 + -1;
    } while (bVar1);
    *cbUsed = -(lVar5 + -1);
    tmp[lVar5 + -2] = (char)sVar3 + 0x80;
    *cbUsed = sVar4;
LAB_001377d9:
    if ((size != 0) || (uVar6 = *cbUsed, cbOut < uVar6)) {
      return false;
    }
    memcpy_s(out,cbOut,tmp + -uVar6,uVar6);
  }
  return true;
}

Assistant:

bool EncodeSize(size_t size, unsigned char * out, size_t cbOut, size_t & cbUsed)
{
	unsigned char tmp[sizeof(unsigned long long)] = { 0 };
	unsigned int i = 0;

	if (size <= 0x7f && cbOut >= 1)
	{
		*out = static_cast<unsigned char>(size);
		cbUsed = 1;
		return true;
	}

	// Else the first byte is the number of following big-endian
	// non-zero bytes
	for (; i < sizeof(unsigned long long) - 1; ++i)
	{
		// Convert incoming size to big-endian order
		size_t offset = sizeof(unsigned long long) - (i + 1);
		tmp[offset] = static_cast<unsigned char>(size);
		size >>= 8;

		if (size == 0)
		{
			cbUsed = i + 1;
			tmp[offset - 1] = static_cast<unsigned char>(0x80 | (cbUsed));
			cbUsed++;
			break;
		}
	}

	// Detect abnormal loop exit
	if (size != 0)
		return false;

	if (cbOut >= cbUsed)
	{
		memcpy_s(out, cbOut, tmp + sizeof(long long) - cbUsed, cbUsed);
		return true;
	}
	
	return false;
}